

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::bitmaskI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  int32_t iVar1;
  Literal *in_RDX;
  uint uVar2;
  Literal *this_00;
  size_t i;
  long lVar3;
  undefined1 local_f0 [8];
  LaneArray<8> lanes;
  
  this_00 = (Literal *)local_f0;
  getLanes<short,8>((LaneArray<8> *)this_00,(wasm *)this,in_RDX);
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    iVar1 = geti32(this_00);
    uVar2 = uVar2 | iVar1 >> 0x1f & 1 << ((byte)lVar3 & 0x1f);
    this_00 = this_00 + 1;
  }
  (__return_storage_ptr__->field_0).i32 = uVar2;
  (__return_storage_ptr__->type).id = 2;
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI16x8() const {
  return bitmask<8, &Literal::getLanesSI16x8>(*this);
}